

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_vex_opc(TCGContext_conflict9 *s,int opc,int r,int v,int rm,int index)

{
  tcg_insn_unit *ptVar1;
  byte *pbVar2;
  byte bVar3;
  
  ptVar1 = s->code_ptr;
  s->code_ptr = ptVar1 + 1;
  if ((opc & 0x11300U) == 0x100 && (rm & 8U) == 0) {
    *ptVar1 = 0xc5;
    bVar3 = (byte)((~r & 8U) << 4);
  }
  else {
    *ptVar1 = 0xc4;
    bVar3 = 3;
    if (((((uint)opc >> 0x10 & 1) == 0) && (bVar3 = 2, ((uint)opc >> 9 & 1) == 0)) &&
       (bVar3 = 1, ((uint)opc >> 8 & 1) == 0)) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x29d,(char *)0x0);
    }
    pbVar2 = s->code_ptr;
    s->code_ptr = pbVar2 + 1;
    *pbVar2 = ((char)((r & 8U) << 4) + (char)(rm & 8U) * '\x04' | bVar3) ^ 0xe0;
    bVar3 = (byte)((uint)opc >> 5) & 0x80;
  }
  bVar3 = (byte)((uint)opc >> 0x11) & 4 | bVar3;
  if (((uint)opc >> 10 & 1) == 0) {
    if (((uint)opc >> 0x11 & 1) == 0) {
      if (((uint)opc >> 0x12 & 1) != 0) {
        bVar3 = bVar3 | 3;
      }
    }
    else {
      bVar3 = bVar3 | 2;
    }
  }
  else {
    bVar3 = bVar3 | 1;
  }
  pbVar2 = s->code_ptr;
  s->code_ptr = pbVar2 + 1;
  *pbVar2 = (byte)((~v & 0xfU) << 3) | bVar3;
  ptVar1 = s->code_ptr;
  s->code_ptr = ptVar1 + 1;
  *ptVar1 = (tcg_insn_unit)opc;
  return;
}

Assistant:

static void tcg_out_vex_opc(TCGContext *s, int opc, int r, int v,
                            int rm, int index)
{
    int tmp = 0;

    /* Use the two byte form if possible, which cannot encode
       VEX.W, VEX.B, VEX.X, or an m-mmmm field other than P_EXT.  */
    if ((opc & (P_EXT | P_EXT38 | P_EXT3A | P_REXW)) == P_EXT
        && ((rm | index) & 8) == 0) {
        /* Two byte VEX prefix.  */
        tcg_out8(s, 0xc5);

        tmp = (r & 8 ? 0 : 0x80);              /* VEX.R */
    } else {
        /* Three byte VEX prefix.  */
        tcg_out8(s, 0xc4);

        /* VEX.m-mmmm */
        if (opc & P_EXT3A) {
            tmp = 3;
        } else if (opc & P_EXT38) {
            tmp = 2;
        } else if (opc & P_EXT) {
            tmp = 1;
        } else {
            g_assert_not_reached();
        }
        tmp |= (r & 8 ? 0 : 0x80);             /* VEX.R */
        tmp |= (index & 8 ? 0 : 0x40);         /* VEX.X */
        tmp |= (rm & 8 ? 0 : 0x20);            /* VEX.B */
        tcg_out8(s, tmp);

        tmp = (opc & P_REXW ? 0x80 : 0);       /* VEX.W */
    }

    tmp |= (opc & P_VEXL ? 0x04 : 0);      /* VEX.L */
    /* VEX.pp */
    if (opc & P_DATA16) {
        tmp |= 1;                          /* 0x66 */
    } else if (opc & P_SIMDF3) {
        tmp |= 2;                          /* 0xf3 */
    } else if (opc & P_SIMDF2) {
        tmp |= 3;                          /* 0xf2 */
    }
    tmp |= (~v & 15) << 3;                 /* VEX.vvvv */
    tcg_out8(s, tmp);
    tcg_out8(s, opc);
}